

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

bool __thiscall QIODevice::atEnd(QIODevice *this)

{
  QObjectData *pQVar1;
  QBindingStorageData *pQVar2;
  int iVar3;
  undefined4 extraout_var;
  char cVar4;
  QDynamicMetaObjectData *pQVar5;
  bool bVar6;
  
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (*(int *)&pQVar1[4].bindingStorage.d == 0) {
    return true;
  }
  pQVar2 = pQVar1[1].bindingStorage.d;
  if ((pQVar2 == (QBindingStorageData *)0x0) || (pQVar2[1].used == 0)) {
LAB_00243311:
    iVar3 = (*(this->super_QObject)._vptr_QObject[0x14])(this);
    bVar6 = CONCAT44(extraout_var,iVar3) == 0;
  }
  else {
    if (*(char *)((long)&pQVar1[4].bindingStorage.d + 4) == '\x01') {
      cVar4 = *(char *)((long)&pQVar1[4].bindingStorage.d + 6);
      if (cVar4 == '\0') {
        iVar3 = (*pQVar1->q_ptr->_vptr_QObject[0xc])();
        cVar4 = '\x02' - (char)iVar3;
        *(char *)((long)&pQVar1[4].bindingStorage.d + 6) = cVar4;
      }
      if (cVar4 == '\x01') {
        pQVar2 = pQVar1[1].bindingStorage.d;
        if (pQVar2 == (QBindingStorageData *)0x0) {
          pQVar5 = (QDynamicMetaObjectData *)0x0;
        }
        else {
          pQVar5 = (QDynamicMetaObjectData *)pQVar2[1].used;
        }
        if (pQVar1[1].metaObject == pQVar5) goto LAB_00243311;
      }
    }
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }